

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<bool>::RemoveLast(RepeatedField<bool> *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LongSooRep *this_00;
  int *piVar6;
  int *__src;
  string *psVar7;
  LongSooRep *this_01;
  bool bVar8;
  LongSooRep local_30;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar3 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (iVar3 < 1) {
    this_00 = (LongSooRep *)
              absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar3,0,"old_size > 0");
  }
  else {
    this_00 = (LongSooRep *)0x0;
  }
  if (this_00 == (LongSooRep *)0x0) {
    bVar8 = (uVar1 & 4) == 0;
    elements(this,bVar8);
    iVar4 = internal::SooRep::size(&this->soo_rep_,bVar8);
    if ((iVar4 != iVar3 + -1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,iVar3 + -1);
    return;
  }
  this_01 = &local_30;
  RemoveLast();
  if (this_00 == this_01) {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (this_00,this_01,"&other != this");
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    uVar1 = this_00->elements_int;
    iVar3 = internal::SooRep::size((SooRep *)this_00,(uVar1 & 4) == 0);
    if (iVar3 != 0) {
      iVar4 = internal::SooRep::size((SooRep *)this_01,(this_01->elements_int & 4) == 0);
      iVar4 = iVar4 + iVar3;
      RepeatedField<int>::Reserve((RepeatedField<int> *)this_01,iVar4);
      uVar2 = this_01->elements_int;
      bVar8 = (uVar2 & 4) == 0;
      piVar6 = RepeatedField<int>::elements((RepeatedField<int> *)this_01,bVar8);
      iVar5 = internal::SooRep::size((SooRep *)this_01,bVar8);
      if ((iVar5 != iVar4) && ((this_01->elements_int & 4) != 0)) {
        internal::LongSooRep::elements(this_01);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)this_01,(uVar2 & 4) == 0,iVar4);
      __src = RepeatedField<int>::elements((RepeatedField<int> *)this_00,(uVar1 & 4) == 0);
      memcpy(piVar6 + iVar5,__src,(long)iVar3 << 2);
      return;
    }
    return;
  }
  RepeatedField<int>::MergeFrom();
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}